

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_set_covered_faces
               (Array<MultiFab_*,_3> *umac,int scomp,int ncomp,
               Vector<double,_std::allocator<double>_> *a_vals)

{
  double dVar1;
  int iVar2;
  BATType BVar3;
  uint uVar4;
  bool bVar5;
  FabFactory<amrex::FArrayBox> *pFVar6;
  iterator pdVar7;
  EBCellFlagFab *this;
  int in_EDX;
  int in_ESI;
  int i_5;
  int j_5;
  int k_5;
  int n_5;
  Dim3 hi_5;
  Dim3 lo_5;
  Box tzbx_1;
  iterator __end5_2;
  iterator __begin5_2;
  range_impl<amrex::Box> *__range5_2;
  int i_4;
  int j_4;
  int k_4;
  int n_4;
  Dim3 hi_4;
  Dim3 lo_4;
  Box tybx_1;
  iterator __end5_1;
  iterator __begin5_1;
  range_impl<amrex::Box> *__range5_1;
  int i_3;
  int j_3;
  int k_3;
  int n_3;
  Dim3 hi_3;
  Dim3 lo_3;
  Box txbx_1;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  Array4<const_double> *az;
  Array4<const_double> *ay;
  Array4<const_double> *ax;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 hi_2;
  Dim3 lo_2;
  Box tzbx;
  iterator __end4_2;
  iterator __begin4_2;
  range_impl<amrex::Box> *__range4_2;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 hi_1;
  Dim3 lo_1;
  Box tybx;
  iterator __end4_1;
  iterator __begin4_1;
  range_impl<amrex::Box> *__range4_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  Box txbx;
  iterator __end4;
  iterator __begin4;
  range_impl<amrex::Box> *__range4;
  FabType fabtyp;
  Array4<double> *w;
  Array4<double> *v;
  Array4<double> *u;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  MFIter mfi;
  Real *vals;
  DeviceVector<Real> vals_dv;
  FabArray<amrex::EBCellFlagFab> *flags;
  Array<const_MultiCutFab_*,_3> *area;
  EBFArrayBoxFactory *factory;
  element_type *in_stack_fffffffffffff238;
  MultiCutFab *in_stack_fffffffffffff240;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff248;
  undefined8 in_stack_fffffffffffff260;
  undefined1 do_tiling_;
  Box *__return_storage_ptr__;
  FabArrayBase *fabarray_;
  MFIter *this_00;
  long local_d80;
  int local_d70;
  int local_d6c;
  int local_d68;
  int local_d64;
  int in_stack_fffffffffffff2a8;
  undefined4 in_stack_fffffffffffff2ac;
  undefined4 in_stack_fffffffffffff2b0;
  int in_stack_fffffffffffff2b4;
  undefined1 local_d24 [52];
  iterator local_cf0;
  undefined1 local_cd8 [40];
  undefined1 *local_cb0;
  int local_ca8;
  int local_ca4;
  BATType local_ca0;
  int local_c9c;
  undefined8 local_c98;
  int local_c90;
  undefined8 local_c84;
  int local_c7c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c78;
  BATType local_c70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c68;
  BATType local_c60;
  undefined1 local_c5c [52];
  iterator local_c28;
  undefined1 local_c10 [40];
  undefined1 *local_be8;
  int local_be0;
  uint local_bdc;
  BATType local_bd8;
  int local_bd4;
  undefined8 local_bd0;
  int local_bc8;
  undefined8 local_bbc;
  int local_bb4;
  _func_int **local_bb0;
  BATType local_ba8;
  _func_int **local_ba0;
  BATType local_b98;
  undefined1 local_b94 [52];
  iterator local_b60;
  undefined1 local_b48 [40];
  undefined1 *local_b20;
  long local_b18 [8];
  long *local_ad8;
  long local_ad0 [8];
  long *local_a90;
  long local_a88 [8];
  long *local_a48;
  int local_a40;
  int local_a3c;
  int local_a38;
  int local_a34;
  Box local_9f4;
  iterator local_9d8;
  iterator local_9c0;
  undefined1 local_9a8 [40];
  undefined1 *local_980;
  int local_978;
  int local_974;
  int local_970;
  int local_96c;
  Box local_92c;
  iterator local_910;
  iterator local_8f8;
  undefined1 local_8e0 [40];
  undefined1 *local_8b8;
  int local_8b0;
  int local_8ac;
  int local_8a8;
  int local_8a4;
  undefined8 local_8a0;
  int local_898;
  undefined8 local_88c;
  int local_884;
  undefined8 local_880;
  int local_878;
  undefined8 local_870;
  int local_868;
  Box local_864;
  iterator local_848;
  iterator local_830;
  undefined1 local_818 [40];
  undefined1 *local_7f0;
  FabType local_7e4;
  long local_7e0 [8];
  long *local_7a0;
  long local_798 [8];
  long *local_758;
  long local_750 [8];
  long *local_710;
  int local_708 [2];
  int local_700;
  int local_6f8 [2];
  int local_6f0;
  undefined1 local_6ec [28];
  undefined1 *local_6d0;
  undefined1 local_6ac [28];
  undefined1 *local_690;
  int local_688 [2];
  int local_680;
  int local_678 [2];
  int local_670;
  undefined1 local_66c [28];
  undefined1 *local_650;
  MFIter local_638;
  double *local_5d8;
  double *local_5d0;
  double *local_5c8;
  undefined1 local_5b8 [32];
  undefined1 local_598 [172];
  int local_4ec;
  uint uStack_4e8;
  BATType local_4e4;
  Box *local_4d0;
  Box *local_4a8;
  undefined8 local_490;
  int local_488;
  Box *local_480;
  int local_474;
  int iStack_470;
  int local_46c;
  undefined8 local_468;
  int local_460;
  element_type *local_458;
  int local_44c;
  int iStack_448;
  int local_444;
  undefined8 local_440;
  int local_438;
  MultiCutFab *local_430;
  uint local_424;
  uint uStack_420;
  int local_41c;
  undefined8 local_418;
  int local_410;
  FabArray<amrex::FArrayBox> *local_408;
  uint local_3fc;
  uint uStack_3f8;
  int local_3f4;
  Box *local_3e0;
  Box *local_3b8;
  undefined8 local_3a0;
  int local_398;
  Box *local_390;
  int local_384;
  int iStack_380;
  int local_37c;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_360;
  BATType local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_348;
  BATType local_344;
  uint local_340;
  int local_33c;
  long *local_338;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  int local_2e8 [2];
  int local_2e0;
  undefined4 local_2d8;
  IntVect local_2d4 [2];
  undefined4 local_2b8;
  IntVect local_2b4;
  int local_2a8 [2];
  int local_2a0;
  undefined4 local_294;
  IntVect local_290;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  BATType local_26c;
  int local_268;
  int local_264;
  long *local_260;
  BATType local_254;
  uint local_250;
  int local_24c;
  long *local_248;
  undefined4 local_23c;
  IntVect *local_238;
  undefined4 local_22c;
  IntVect *local_228;
  undefined4 local_21c;
  IntVect *local_218;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  IntVect *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  undefined4 local_1dc;
  IntVect *local_1d8;
  undefined4 local_1cc;
  IntVect *local_1c8;
  undefined4 local_1bc;
  IntVect *local_1b8;
  undefined4 local_1ac;
  BATOp *local_1a8;
  undefined4 local_19c;
  BATOp *local_198;
  undefined4 local_18c;
  BATOp *local_188;
  undefined4 local_17c;
  BATOp *local_178;
  undefined4 local_16c;
  BATOp *local_168;
  undefined4 local_15c;
  BATOp *local_158;
  undefined4 local_14c;
  undefined1 *local_148;
  undefined4 local_13c;
  undefined1 *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  Box *local_118;
  undefined4 local_10c;
  Box *local_108;
  undefined4 local_fc;
  Box *local_f8;
  undefined4 local_ec;
  Box *local_e8;
  undefined4 local_dc;
  Box *local_d8;
  undefined4 local_cc;
  Box *local_c8;
  undefined4 local_bc;
  Box *local_b8;
  undefined4 local_ac;
  Box *local_a8;
  undefined4 local_9c;
  Box *local_98;
  undefined4 local_8c;
  FabArray<amrex::FArrayBox> *local_88;
  undefined4 local_7c;
  FabArray<amrex::FArrayBox> *local_78;
  undefined4 local_6c;
  FabArray<amrex::FArrayBox> *local_68;
  undefined4 local_5c;
  MultiCutFab *local_58;
  undefined4 local_4c;
  MultiCutFab *local_48;
  undefined4 local_3c;
  MultiCutFab *local_38;
  undefined4 local_2c;
  element_type *local_28;
  undefined4 local_1c;
  element_type *local_18;
  undefined4 local_c;
  element_type *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff260 >> 0x38);
  local_598._48_4_ = in_EDX;
  local_598._52_4_ = in_ESI;
  std::array<amrex::MultiFab_*,_3UL>::operator[]
            ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff240,
             (size_type)in_stack_fffffffffffff238);
  pFVar6 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x1143ace);
  if (pFVar6 == (FabFactory<amrex::FArrayBox> *)0x0) {
    local_d80 = 0;
  }
  else {
    local_d80 = __dynamic_cast(pFVar6,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo);
  }
  local_598._32_8_ = local_d80;
  if (local_d80 != 0) {
    fabarray_ = (FabArrayBase *)local_598;
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff240);
    local_598._24_8_ = fabarray_;
    local_5b8._24_8_ =
         EBFArrayBoxFactory::getMultiEBCellFlagFab((EBFArrayBoxFactory *)in_stack_fffffffffffff240);
    Vector<double,_std::allocator<double>_>::size
              ((Vector<double,_std::allocator<double>_> *)0x1143b6b);
    this_00 = (MFIter *)local_5b8;
    PODVector<double,_std::allocator<double>_>::PODVector
              ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff240,
               (size_type)in_stack_fffffffffffff238);
    local_5c8 = (double *)
                std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff238);
    local_5d0 = (double *)
                std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff238);
    pdVar7 = PODVector<double,_std::allocator<double>_>::begin
                       ((PODVector<double,_std::allocator<double>_> *)this_00);
    Gpu::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double*>
              (local_5c8,local_5d0,pdVar7);
    local_5d8 = PODVector<double,_std::allocator<double>_>::data
                          ((PODVector<double,_std::allocator<double>_> *)this_00);
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff240,
               (size_type)in_stack_fffffffffffff238);
    TilingIfNotGPU();
    MFIter::MFIter(this_00,fabarray_,(bool)do_tiling_);
    while (bVar5 = MFIter::isValid(&local_638), bVar5) {
      local_294 = 0;
      IntVect::IntVect(&local_290,1,0,0);
      local_2a0 = local_290.vect[2];
      local_2a8[0] = local_290.vect[0];
      local_2a8[1] = local_290.vect[1];
      local_680 = local_290.vect[2];
      local_688[0] = local_290.vect[0];
      local_688[1] = local_290.vect[1];
      local_678[0] = local_290.vect[0];
      local_678[1] = local_290.vect[1];
      local_670 = local_290.vect[2];
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
                      (IntVect *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8));
      local_650 = local_66c;
      local_2b8 = 1;
      IntVect::IntVect(&local_2b4,0,1,0);
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
                      (IntVect *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8));
      local_690 = local_6ac;
      local_2d8 = 2;
      IntVect::IntVect(local_2d4,0,0,1);
      local_2e0 = local_2d4[0].vect[2];
      local_2e8[0] = local_2d4[0].vect[0];
      local_2e8[1] = local_2d4[0].vect[1];
      local_700 = local_2d4[0].vect[2];
      local_708[0] = local_2d4[0].vect[0];
      local_708[1] = local_2d4[0].vect[1];
      local_6f8[0] = local_2d4[0].vect[0];
      local_6f8[1] = local_2d4[0].vect[1];
      local_6f0 = local_2d4[0].vect[2];
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
                      (IntVect *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8));
      local_6d0 = local_6ec;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff240,
                 (size_type)in_stack_fffffffffffff238);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff248,(MFIter *)in_stack_fffffffffffff240);
      local_710 = local_750;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff240,
                 (size_type)in_stack_fffffffffffff238);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff248,(MFIter *)in_stack_fffffffffffff240);
      local_758 = local_798;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff240,
                 (size_type)in_stack_fffffffffffff238);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff248,(MFIter *)in_stack_fffffffffffff240);
      local_7a0 = local_7e0;
      this = FabArray<amrex::EBCellFlagFab>::operator[]
                       ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff240,
                        (MFIter *)in_stack_fffffffffffff238);
      local_7e4 = EBCellFlagFab::getType(this);
      if (local_7e4 == covered) {
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff240);
        local_7f0 = local_818;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        while (bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_830,&local_848), bVar5) {
          __return_storage_ptr__ = &local_864;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    (__return_storage_ptr__,&local_830);
          local_fc = 0;
          local_474 = (__return_storage_ptr__->smallend).vect[0];
          local_10c = 1;
          iStack_470 = (__return_storage_ptr__->smallend).vect[1];
          local_880 = *(undefined8 *)(__return_storage_ptr__->smallend).vect;
          local_11c = 2;
          local_878 = (__return_storage_ptr__->smallend).vect[2];
          local_218 = &__return_storage_ptr__->bigend;
          local_21c = 0;
          local_384 = local_218->vect[0];
          local_228 = &__return_storage_ptr__->bigend;
          local_22c = 1;
          iStack_380 = (__return_storage_ptr__->bigend).vect[1];
          local_8a0 = *(undefined8 *)local_218->vect;
          local_238 = &__return_storage_ptr__->bigend;
          local_23c = 2;
          local_898 = (__return_storage_ptr__->bigend).vect[2];
          for (local_8a4 = local_598._52_4_; iVar2 = local_878,
              local_8a4 < (int)(local_598._52_4_ + local_598._48_4_); local_8a4 = local_8a4 + 1) {
            while (local_8a8 = iVar2, iVar2 = iStack_470, local_8a8 <= local_898) {
              while (local_8ac = iVar2, iVar2 = local_474, local_8ac <= iStack_380) {
                while (local_8b0 = iVar2, local_8b0 <= local_384) {
                  local_2f0 = local_710;
                  local_2f4 = local_8b0;
                  local_2f8 = local_8ac;
                  local_2fc = local_8a8;
                  local_300 = local_8a4;
                  *(double *)
                   (*local_710 +
                   ((long)(local_8b0 - (int)local_710[4]) +
                    (long)(local_8ac - *(int *)((long)local_710 + 0x24)) * local_710[1] +
                    (long)(local_8a8 - (int)local_710[5]) * local_710[2] +
                   (long)local_8a4 * local_710[3]) * 8) = local_5d8[local_8a4];
                  iVar2 = local_8b0 + 1;
                }
                iVar2 = local_8ac + 1;
              }
              iVar2 = local_8a8 + 1;
            }
          }
          local_88c = local_8a0;
          local_884 = local_898;
          local_870 = local_880;
          local_868 = local_878;
          local_490 = local_880;
          local_488 = local_878;
          local_480 = __return_storage_ptr__;
          local_46c = local_878;
          local_3a0 = local_8a0;
          local_398 = local_898;
          local_390 = __return_storage_ptr__;
          local_37c = local_898;
          local_118 = __return_storage_ptr__;
          local_108 = __return_storage_ptr__;
          local_f8 = __return_storage_ptr__;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_830);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff240);
        local_8b8 = local_8e0;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        while (bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_8f8,&local_910), bVar5) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_92c,&local_8f8);
          local_cc = 0;
          local_dc = 1;
          local_ec = 2;
          local_1e8 = &local_92c.bigend;
          local_1ec = 0;
          local_1f8 = &local_92c.bigend;
          local_1fc = 1;
          local_208 = &local_92c.bigend;
          local_20c = 2;
          for (local_96c = local_598._52_4_; iVar2 = local_92c.smallend.vect[2],
              local_96c < (int)(local_598._52_4_ + local_598._48_4_); local_96c = local_96c + 1) {
            while (local_970 = iVar2, iVar2 = local_92c.smallend.vect[1],
                  local_970 <= local_92c.bigend.vect[2]) {
              while (local_974 = iVar2, iVar2 = local_92c.smallend.vect[0],
                    local_974 <= local_92c.bigend.vect[1]) {
                while (local_978 = iVar2, local_978 <= local_92c.bigend.vect[0]) {
                  local_308 = local_758;
                  local_30c = local_978;
                  local_310 = local_974;
                  local_314 = local_970;
                  local_318 = local_96c;
                  *(double *)
                   (*local_758 +
                   ((long)(local_978 - (int)local_758[4]) +
                    (long)(local_974 - *(int *)((long)local_758 + 0x24)) * local_758[1] +
                    (long)(local_970 - (int)local_758[5]) * local_758[2] +
                   (long)local_96c * local_758[3]) * 8) = local_5d8[local_96c];
                  iVar2 = local_978 + 1;
                }
                iVar2 = local_974 + 1;
              }
              iVar2 = local_970 + 1;
            }
          }
          local_4a8 = &local_92c;
          local_3b8 = &local_92c;
          local_e8 = &local_92c;
          local_d8 = &local_92c;
          local_c8 = &local_92c;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_8f8);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff240);
        local_980 = local_9a8;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        while (bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_9c0,&local_9d8), bVar5) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_9f4,&local_9c0);
          local_9c = 0;
          local_ac = 1;
          local_bc = 2;
          local_1b8 = &local_9f4.bigend;
          local_1bc = 0;
          local_1c8 = &local_9f4.bigend;
          local_1cc = 1;
          local_1d8 = &local_9f4.bigend;
          local_1dc = 2;
          for (local_a34 = local_598._52_4_; iVar2 = local_9f4.smallend.vect[2],
              local_a34 < (int)(local_598._52_4_ + local_598._48_4_); local_a34 = local_a34 + 1) {
            while (local_a38 = iVar2, iVar2 = local_9f4.smallend.vect[1],
                  local_a38 <= local_9f4.bigend.vect[2]) {
              while (local_a3c = iVar2, iVar2 = local_9f4.smallend.vect[0],
                    local_a3c <= local_9f4.bigend.vect[1]) {
                while (local_a40 = iVar2, local_a40 <= local_9f4.bigend.vect[0]) {
                  local_320 = local_7a0;
                  local_324 = local_a40;
                  local_328 = local_a3c;
                  local_32c = local_a38;
                  local_330 = local_a34;
                  *(double *)
                   (*local_7a0 +
                   ((long)(local_a40 - (int)local_7a0[4]) +
                    (long)(local_a3c - *(int *)((long)local_7a0 + 0x24)) * local_7a0[1] +
                    (long)(local_a38 - (int)local_7a0[5]) * local_7a0[2] +
                   (long)local_a34 * local_7a0[3]) * 8) = local_5d8[local_a34];
                  iVar2 = local_a40 + 1;
                }
                iVar2 = local_a3c + 1;
              }
              iVar2 = local_a38 + 1;
            }
          }
          local_4d0 = &local_9f4;
          local_3e0 = &local_9f4;
          local_b8 = &local_9f4;
          local_a8 = &local_9f4;
          local_98 = &local_9f4;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_9c0);
        }
      }
      else if (local_7e4 == singlevalued) {
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff240,
                   (size_type)in_stack_fffffffffffff238);
        MultiCutFab::const_array(in_stack_fffffffffffff240,(MFIter *)in_stack_fffffffffffff238);
        local_a48 = local_a88;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff240,
                   (size_type)in_stack_fffffffffffff238);
        MultiCutFab::const_array(in_stack_fffffffffffff240,(MFIter *)in_stack_fffffffffffff238);
        local_a90 = local_ad0;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff240,
                   (size_type)in_stack_fffffffffffff238);
        MultiCutFab::const_array(in_stack_fffffffffffff240,(MFIter *)in_stack_fffffffffffff238);
        local_ad8 = local_b18;
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff240);
        local_b20 = local_b48;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        while (bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_b60,(iterator *)(local_b94 + 0x1c)), bVar5) {
          in_stack_fffffffffffff248 = (FabArray<amrex::FArrayBox> *)local_b94;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    ((Box *)in_stack_fffffffffffff248,&local_b60);
          local_6c = 0;
          local_4ec = *(int *)&(in_stack_fffffffffffff248->super_FabArrayBase)._vptr_FabArrayBase;
          local_7c = 1;
          uStack_4e8 = *(int *)((long)&(in_stack_fffffffffffff248->super_FabArrayBase).
                                       _vptr_FabArrayBase + 4);
          local_bb0 = (in_stack_fffffffffffff248->super_FabArrayBase)._vptr_FabArrayBase;
          local_8c = 2;
          local_ba8 = (in_stack_fffffffffffff248->super_FabArrayBase).boxarray.m_bat.m_bat_type;
          local_188 = &(in_stack_fffffffffffff248->super_FabArrayBase).boxarray.m_bat.m_op;
          local_18c = 0;
          local_3fc = (local_188->m_indexType).m_typ.itype;
          local_198 = &(in_stack_fffffffffffff248->super_FabArrayBase).boxarray.m_bat.m_op;
          local_19c = 1;
          uStack_3f8 = (in_stack_fffffffffffff248->super_FabArrayBase).boxarray.m_bat.m_op.
                       m_bndryReg.m_typ.itype;
          local_bd0 = *(undefined8 *)local_188;
          local_1a8 = &(in_stack_fffffffffffff248->super_FabArrayBase).boxarray.m_bat.m_op;
          local_1ac = 2;
          local_bc8 = (in_stack_fffffffffffff248->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg
                      .m_crse_ratio.vect[0];
          for (local_bd4 = local_598._52_4_; BVar3 = local_ba8,
              local_bd4 < (int)(local_598._52_4_ + local_598._48_4_); local_bd4 = local_bd4 + 1) {
            while (local_bd8 = BVar3, uVar4 = uStack_4e8, (int)local_bd8 <= local_bc8) {
              while (local_bdc = uVar4, iVar2 = local_4ec, (int)local_bdc <= (int)uStack_3f8) {
                while (local_be0 = iVar2, local_be0 <= (int)local_3fc) {
                  local_248 = local_a48;
                  local_24c = local_be0;
                  local_250 = local_bdc;
                  local_254 = local_bd8;
                  dVar1 = *(double *)
                           (*local_a48 +
                           ((long)(local_be0 - (int)local_a48[4]) +
                            (long)(int)(local_bdc - *(int *)((long)local_a48 + 0x24)) * local_a48[1]
                           + (long)(int)(local_bd8 - (int)local_a48[5]) * local_a48[2]) * 8);
                  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                    local_338 = local_710;
                    local_33c = local_be0;
                    local_340 = local_bdc;
                    local_344 = local_bd8;
                    local_348 = local_bd4;
                    *(double *)
                     (*local_710 +
                     ((long)(local_be0 - (int)local_710[4]) +
                      (long)(int)(local_bdc - *(int *)((long)local_710 + 0x24)) * local_710[1] +
                      (long)(int)(local_bd8 - (int)local_710[5]) * local_710[2] +
                     (long)local_bd4 * local_710[3]) * 8) = local_5d8[local_bd4];
                  }
                  iVar2 = local_be0 + 1;
                }
                uVar4 = local_bdc + 1;
              }
              BVar3 = local_bd8 + indexType;
            }
          }
          local_bbc = local_bd0;
          local_bb4 = local_bc8;
          local_ba0 = local_bb0;
          local_b98 = local_ba8;
          local_598._144_8_ = local_bb0;
          local_598._152_4_ = local_ba8;
          local_598._160_8_ = in_stack_fffffffffffff248;
          local_4e4 = local_ba8;
          local_418 = local_bd0;
          local_410 = local_bc8;
          local_408 = in_stack_fffffffffffff248;
          local_3f4 = local_bc8;
          local_88 = in_stack_fffffffffffff248;
          local_78 = in_stack_fffffffffffff248;
          local_68 = in_stack_fffffffffffff248;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_b60);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff240);
        local_be8 = local_c10;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        while (bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_c28,(iterator *)(local_c5c + 0x1c)), bVar5) {
          in_stack_fffffffffffff240 = (MultiCutFab *)local_c5c;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    ((Box *)in_stack_fffffffffffff240,&local_c28);
          local_3c = 0;
          local_598._132_4_ =
               *(undefined4 *)
                &(in_stack_fffffffffffff240->m_data).super_FabArrayBase._vptr_FabArrayBase;
          local_4c = 1;
          local_598._136_4_ =
               *(int *)((long)&(in_stack_fffffffffffff240->m_data).super_FabArrayBase.
                               _vptr_FabArrayBase + 4);
          local_c78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (in_stack_fffffffffffff240->m_data).super_FabArrayBase._vptr_FabArrayBase;
          local_5c = 2;
          local_c70 = (in_stack_fffffffffffff240->m_data).super_FabArrayBase.boxarray.m_bat.
                      m_bat_type;
          local_158 = &(in_stack_fffffffffffff240->m_data).super_FabArrayBase.boxarray.m_bat.m_op;
          local_15c = 0;
          local_424 = (local_158->m_indexType).m_typ.itype;
          local_168 = &(in_stack_fffffffffffff240->m_data).super_FabArrayBase.boxarray.m_bat.m_op;
          local_16c = 1;
          uStack_420 = (in_stack_fffffffffffff240->m_data).super_FabArrayBase.boxarray.m_bat.m_op.
                       m_bndryReg.m_typ.itype;
          local_c98 = *(undefined8 *)local_158;
          local_178 = &(in_stack_fffffffffffff240->m_data).super_FabArrayBase.boxarray.m_bat.m_op;
          local_17c = 2;
          local_c90 = (in_stack_fffffffffffff240->m_data).super_FabArrayBase.boxarray.m_bat.m_op.
                      m_bndryReg.m_crse_ratio.vect[0];
          for (local_c9c = local_598._52_4_; BVar3 = local_c70,
              local_c9c < (int)(local_598._52_4_ + local_598._48_4_); local_c9c = local_c9c + 1) {
            while (local_ca0 = BVar3, iVar2 = local_598._136_4_, (int)local_ca0 <= local_c90) {
              while (local_ca4 = iVar2, iVar2 = local_598._132_4_, local_ca4 <= (int)uStack_420) {
                while (local_ca8 = iVar2, local_ca8 <= (int)local_424) {
                  local_260 = local_a90;
                  local_264 = local_ca8;
                  local_268 = local_ca4;
                  local_26c = local_ca0;
                  dVar1 = *(double *)
                           (*local_a90 +
                           ((long)(local_ca8 - (int)local_a90[4]) +
                            (long)(local_ca4 - *(int *)((long)local_a90 + 0x24)) * local_a90[1] +
                           (long)(int)(local_ca0 - (int)local_a90[5]) * local_a90[2]) * 8);
                  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                    local_350 = local_758;
                    local_354 = local_ca8;
                    local_358 = local_ca4;
                    local_35c = local_ca0;
                    local_360 = local_c9c;
                    *(double *)
                     (*local_758 +
                     ((long)(local_ca8 - (int)local_758[4]) +
                      (long)(local_ca4 - *(int *)((long)local_758 + 0x24)) * local_758[1] +
                      (long)(int)(local_ca0 - (int)local_758[5]) * local_758[2] +
                     (long)local_c9c * local_758[3]) * 8) = local_5d8[local_c9c];
                  }
                  iVar2 = local_ca8 + 1;
                }
                iVar2 = local_ca4 + 1;
              }
              BVar3 = local_ca0 + indexType;
            }
          }
          local_c84 = local_c98;
          local_c7c = local_c90;
          local_c68 = local_c78;
          local_c60 = local_c70;
          local_598._104_8_ = local_c78;
          local_598._112_4_ = local_c70;
          local_598._120_8_ = in_stack_fffffffffffff240;
          local_598._140_4_ = local_c70;
          local_440 = local_c98;
          local_438 = local_c90;
          local_430 = in_stack_fffffffffffff240;
          local_41c = local_c90;
          local_58 = in_stack_fffffffffffff240;
          local_48 = in_stack_fffffffffffff240;
          local_38 = in_stack_fffffffffffff240;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_c28);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff240);
        local_cb0 = local_cd8;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff240);
        while (bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_cf0,(iterator *)(local_d24 + 0x1c)), bVar5) {
          in_stack_fffffffffffff238 = (element_type *)local_d24;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    ((Box *)in_stack_fffffffffffff238,&local_cf0);
          local_c = 0;
          local_598._92_4_ =
               *(undefined4 *)
                &(in_stack_fffffffffffff238->m_abox).
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start;
          local_1c = 1;
          local_598._96_4_ =
               *(int *)((long)&(in_stack_fffffffffffff238->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_start + 4);
          local_598._64_8_ =
               (in_stack_fffffffffffff238->m_abox).
               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_2c = 2;
          local_598._72_4_ =
               *(undefined4 *)
                &(in_stack_fffffffffffff238->m_abox).
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          local_128 = (int *)((long)&(in_stack_fffffffffffff238->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 4);
          local_12c = 0;
          in_stack_fffffffffffff2b4 = *local_128;
          local_138 = (undefined1 *)
                      ((long)&(in_stack_fffffffffffff238->m_abox).
                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4);
          local_13c = 1;
          iStack_448 = *(int *)&(in_stack_fffffffffffff238->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage;
          local_468 = *(undefined8 *)local_128;
          local_148 = (undefined1 *)
                      ((long)&(in_stack_fffffffffffff238->m_abox).
                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4);
          local_14c = 2;
          in_stack_fffffffffffff2a8 =
               *(int *)((long)&(in_stack_fffffffffffff238->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 4);
          for (local_d64 = local_598._52_4_; local_d68 = local_598._72_4_,
              local_d64 < (int)(local_598._52_4_ + local_598._48_4_); local_d64 = local_d64 + 1) {
            for (; local_d6c = local_598._96_4_, local_d68 <= in_stack_fffffffffffff2a8;
                local_d68 = local_d68 + 1) {
              for (; local_d70 = local_598._92_4_, local_d6c <= iStack_448;
                  local_d6c = local_d6c + 1) {
                for (; local_d70 <= in_stack_fffffffffffff2b4; local_d70 = local_d70 + 1) {
                  local_278 = local_ad8;
                  local_27c = local_d70;
                  local_280 = local_d6c;
                  local_284 = local_d68;
                  dVar1 = *(double *)
                           (*local_ad8 +
                           ((long)(local_d70 - (int)local_ad8[4]) +
                            (long)(local_d6c - *(int *)((long)local_ad8 + 0x24)) * local_ad8[1] +
                           (long)(local_d68 - (int)local_ad8[5]) * local_ad8[2]) * 8);
                  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                    local_368 = local_7a0;
                    local_36c = local_d70;
                    local_370 = local_d6c;
                    local_374 = local_d68;
                    local_378 = local_d64;
                    *(double *)
                     (*local_7a0 +
                     ((long)(local_d70 - (int)local_7a0[4]) +
                      (long)(local_d6c - *(int *)((long)local_7a0 + 0x24)) * local_7a0[1] +
                      (long)(local_d68 - (int)local_7a0[5]) * local_7a0[2] +
                     (long)local_d64 * local_7a0[3]) * 8) = local_5d8[local_d64];
                  }
                }
              }
            }
          }
          local_598._80_8_ = in_stack_fffffffffffff238;
          local_598._100_4_ = local_598._72_4_;
          local_460 = in_stack_fffffffffffff2a8;
          local_458 = in_stack_fffffffffffff238;
          local_44c = in_stack_fffffffffffff2b4;
          local_444 = in_stack_fffffffffffff2a8;
          local_28 = in_stack_fffffffffffff238;
          local_18 = in_stack_fffffffffffff238;
          local_8 = in_stack_fffffffffffff238;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_cf0);
        }
      }
      MFIter::operator++(&local_638);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffff240);
    PODVector<double,_std::allocator<double>_>::~PODVector
              ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff240);
  }
  return;
}

Assistant:

void
EB_set_covered_faces (const Array<MultiFab*,AMREX_SPACEDIM>& umac, const int scomp, const int ncomp, const Vector<Real>& a_vals )
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(umac[0]->Factory()));
    if (factory == nullptr) return;

    const auto& area = factory->getAreaFrac();
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ASSERT(umac[0]->nComp() >= scomp+ncomp);

    Gpu::DeviceVector<Real> vals_dv(a_vals.size());
    Gpu::copy(Gpu::hostToDevice, a_vals.begin(), a_vals.end(), vals_dv.begin());
    Real const* AMREX_RESTRICT vals = vals_dv.data();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*umac[0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        AMREX_D_TERM(const Box& xbx = mfi.tilebox(IntVect::TheDimensionVector(0));,
                     const Box& ybx = mfi.tilebox(IntVect::TheDimensionVector(1));,
                     const Box& zbx = mfi.tilebox(IntVect::TheDimensionVector(2)));
        AMREX_D_TERM(Array4<Real> const& u = umac[0]->array(mfi);,
                     Array4<Real> const& v = umac[1]->array(mfi);,
                     Array4<Real> const& w = umac[2]->array(mfi));

        auto fabtyp = flags[mfi].getType();
        if (fabtyp == FabType::covered)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            u(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            v(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            w(i,j,k,n) = vals[n];
                        }}}
                    }
                }
            );
        }
        else if (fabtyp == FabType::singlevalued)
        {
            AMREX_D_TERM(Array4<Real const> const& ax = area[0]->const_array(mfi);,
                         Array4<Real const> const& ay = area[1]->const_array(mfi);,
                         Array4<Real const> const& az = area[2]->const_array(mfi));
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ax(i,j,k) == 0.0) u(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ay(i,j,k) == 0.0) v(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (az(i,j,k) == 0.0) w(i,j,k,n) = vals[n];
                        }}}
                    }
                }
            );
        }
    }
}